

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtrclient.c
# Opt level: O3

int template_put(void *closure,char *name,int escape,FILE *file)

{
  uint uVar1;
  uint *puVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  size_t __n;
  ulong uVar6;
  long in_FS_OFFSET;
  char prefix_str [46];
  char acStack_68 [56];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  __n = strlen(name);
  iVar4 = -1;
  if ((__n != 0 & *closure) == 1) {
    uVar1 = *(uint *)((long)closure + 4);
    if (*(uint *)(*(long *)((long)closure + 8) + 0x108) <= uVar1) {
      __assert_fail("pos < array->count",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/./third-party/tommyds/tommyarray.h"
                    ,0x61,"void **tommy_array_ref(tommy_array *, tommy_count_t)");
    }
    uVar3 = 0x1f;
    if ((uVar1 | 1) != 0) {
      for (; (uVar1 | 1) >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    puVar2 = *(uint **)(*(long *)(*(long *)((long)closure + 8) + (ulong)uVar3 * 8) +
                       (ulong)uVar1 * 8);
    iVar4 = strncmp("prefix",name,__n);
    if (iVar4 == 0) {
      lrtr_ip_addr_to_str(puVar2 + 1,acStack_68,0x2e);
      fputs(acStack_68,(FILE *)file);
      iVar4 = 0;
    }
    else {
      iVar4 = strncmp("length",name,__n);
      if (iVar4 == 0) {
        uVar6 = (ulong)(byte)puVar2[6];
      }
      else {
        iVar4 = strncmp("maxlen",name,__n);
        if (iVar4 == 0) {
          uVar6 = (ulong)*(byte *)((long)puVar2 + 0x19);
        }
        else {
          iVar5 = strncmp("origin",name,__n);
          iVar4 = 0;
          if (iVar5 != 0) goto LAB_0010375e;
          uVar6 = (ulong)*puVar2;
        }
      }
      iVar4 = 0;
      fprintf((FILE *)file,"%d",uVar6);
    }
  }
LAB_0010375e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

static int template_put(void *closure, const char *name, __attribute__((unused)) int escape, FILE *file)
{
	struct exporter_state *state = closure;

	size_t namelen = strlen(name);

	if (!state->roa_section || namelen == 0)
		return MUSTACH_ERROR_SYSTEM;

	struct pfx_record *pfx_record = tommy_array_get(state->roas, state->current_roa);

	if (strncmp("prefix", name, namelen) == 0) {
		char prefix_str[INET6_ADDRSTRLEN];

		lrtr_ip_addr_to_str(&pfx_record->prefix, prefix_str, sizeof(prefix_str));
		fputs(prefix_str, file);

	} else if (strncmp("length", name, namelen) == 0) {
		fprintf(file, "%d", pfx_record->min_len);

	} else if (strncmp("maxlen", name, namelen) == 0) {
		fprintf(file, "%d", pfx_record->max_len);

	} else if (strncmp("origin", name, namelen) == 0) {
		fprintf(file, "%d", pfx_record->asn);
	}

	return MUSTACH_OK;
}